

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void jinit_marker_reader(j_decompress_ptr cinfo)

{
  jpeg_marker_reader *pjVar1;
  j_decompress_ptr in_RDI;
  int i;
  my_marker_ptr marker;
  int local_14;
  
  pjVar1 = (jpeg_marker_reader *)(*in_RDI->mem->alloc_small)((j_common_ptr)in_RDI,0,0x108);
  in_RDI->marker = pjVar1;
  pjVar1->reset_marker_reader = reset_marker_reader;
  pjVar1->read_markers = read_markers;
  pjVar1->read_restart_marker = read_restart_marker;
  pjVar1[1].reset_marker_reader = skip_variable;
  *(undefined4 *)&pjVar1[4].read_restart_marker = 0;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    (&pjVar1[1].read_markers)[local_14] = skip_variable;
    *(undefined4 *)((long)&pjVar1[4].read_restart_marker + (long)local_14 * 4 + 4) = 0;
  }
  pjVar1[1].read_markers = get_interesting_appn;
  pjVar1[4].reset_marker_reader = get_interesting_appn;
  reset_marker_reader(in_RDI);
  return;
}

Assistant:

GLOBAL(void)
jinit_marker_reader(j_decompress_ptr cinfo)
{
  my_marker_ptr marker;
  int i;

  /* Create subobject in permanent pool */
  marker = (my_marker_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                sizeof(my_marker_reader));
  cinfo->marker = (struct jpeg_marker_reader *)marker;
  /* Initialize public method pointers */
  marker->pub.reset_marker_reader = reset_marker_reader;
  marker->pub.read_markers = read_markers;
  marker->pub.read_restart_marker = read_restart_marker;
  /* Initialize COM/APPn processing.
   * By default, we examine and then discard APP0 and APP14,
   * but simply discard COM and all other APPn.
   */
  marker->process_COM = skip_variable;
  marker->length_limit_COM = 0;
  for (i = 0; i < 16; i++) {
    marker->process_APPn[i] = skip_variable;
    marker->length_limit_APPn[i] = 0;
  }
  marker->process_APPn[0] = get_interesting_appn;
  marker->process_APPn[14] = get_interesting_appn;
  /* Reset marker processing state */
  reset_marker_reader(cinfo);
}